

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColPivHouseholderQR.h
# Opt level: O0

void __thiscall
Eigen::ColPivHouseholderQR<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
_solve_impl<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>>
          (ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>> *this,
          Matrix<float,__1,__1,_0,__1,__1> *rhs,Matrix<float,__1,_1,_0,__1,_1> *dst)

{
  long lVar1;
  HouseholderSequence<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1>
  *this_00;
  PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *pPVar2;
  Scalar *pSVar3;
  Index IVar4;
  RowXpr local_1f0;
  long local_1c0;
  Index i_1;
  RowXpr local_188;
  Index local_150;
  Index i;
  Type local_110;
  Type local_d8;
  HouseholderSequenceType local_90;
  AdjointReturnType local_68;
  undefined1 local_40 [8];
  PlainObject c;
  Index nonzero_pivots;
  Matrix<float,__1,_1,_0,__1,_1> *dst_local;
  Matrix<float,__1,__1,_0,__1,__1> *rhs_local;
  ColPivHouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this_local;
  
  c.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       ColPivHouseholderQR<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::nonzeroPivots
                 ((ColPivHouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)this);
  if (c.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols == 0) {
    DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)dst);
  }
  else {
    Matrix<float,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_40,rhs);
    ColPivHouseholderQR<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::householderQ
              (&local_90,(ColPivHouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)this);
    this_00 = HouseholderSequence<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>
              ::setLength(&local_90,
                          c.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols);
    HouseholderSequence<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>
    ::adjoint(&local_68,this_00);
    MatrixBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    applyOnTheLeft<Eigen::HouseholderSequence<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,1>>
              ((MatrixBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_40,
               (EigenBase<Eigen::HouseholderSequence<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1>_>
                *)&local_68);
    DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::topLeftCorner<long,long>
              (&local_110,(DenseBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)this,
               c.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
               c.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
    MatrixBase<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,-1,false>>::
    triangularView<2u>(&local_d8,&local_110);
    DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::topRows<long>
              ((Type *)&i,(DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_40,
               c.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
    TriangularViewImpl<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,-1,false>const,2u,Eigen::Dense>
    ::solveInPlace<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>>
              ((TriangularViewImpl<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,false>const,2u,Eigen::Dense>
                *)&local_d8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
               &i);
    for (local_150 = 0;
        local_150 <
        c.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
        local_150 = local_150 + 1) {
      DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::row
                (&local_188,(DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_40,
                 local_150);
      pPVar2 = &PermutationMatrix<-1,_-1,_int>::indices
                          ((PermutationMatrix<_1,__1,_int> *)(this + 0x28))->
                super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>;
      pSVar3 = PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::coeff(pPVar2,local_150);
      DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::row
                ((RowXpr *)&i_1,(DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)dst,
                 (long)*pSVar3);
      Block<Eigen::Matrix<float,-1,1,0,-1,1>,1,1,false>::operator=
                ((Block<Eigen::Matrix<float,_1,1,0,_1,1>,1,1,false> *)&i_1,
                 (DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
                 &local_188);
    }
    local_1c0 = c.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
    while( true ) {
      lVar1 = local_1c0;
      IVar4 = ColPivHouseholderQR<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((ColPivHouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)this);
      if (IVar4 <= lVar1) break;
      pPVar2 = &PermutationMatrix<-1,_-1,_int>::indices
                          ((PermutationMatrix<_1,__1,_int> *)(this + 0x28))->
                super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>;
      pSVar3 = PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::coeff(pPVar2,local_1c0);
      DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::row
                (&local_1f0,(DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)dst,(long)*pSVar3);
      DenseBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1,_1,_false>_>::setZero
                ((DenseBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1,_1,_false>_> *)
                 &local_1f0);
      local_1c0 = local_1c0 + 1;
    }
    Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_40);
  }
  return;
}

Assistant:

void ColPivHouseholderQR<_MatrixType>::_solve_impl(const RhsType &rhs, DstType &dst) const
{
  const Index nonzero_pivots = nonzeroPivots();

  if(nonzero_pivots == 0)
  {
    dst.setZero();
    return;
  }

  typename RhsType::PlainObject c(rhs);

  c.applyOnTheLeft(householderQ().setLength(nonzero_pivots).adjoint() );

  m_qr.topLeftCorner(nonzero_pivots, nonzero_pivots)
      .template triangularView<Upper>()
      .solveInPlace(c.topRows(nonzero_pivots));

  for(Index i = 0; i < nonzero_pivots; ++i) dst.row(m_colsPermutation.indices().coeff(i)) = c.row(i);
  for(Index i = nonzero_pivots; i < cols(); ++i) dst.row(m_colsPermutation.indices().coeff(i)).setZero();
}